

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O1

void oonf_timer_remove(oonf_timer_class *info)

{
  oonf_timer_instance *poVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  oonf_timer_instance *timer;
  
  if (((info->_node).next != (list_entity *)0x0) && ((info->_node).prev != (list_entity *)0x0)) {
    plVar3 = (_timer_tree.list_head.next)->prev;
    timer = (oonf_timer_instance *)_timer_tree.list_head.next;
    while (plVar3 != _timer_tree.list_head.prev) {
      poVar1 = (oonf_timer_instance *)(timer->_node).list.next;
      if (timer->class == info) {
        oonf_timer_stop(timer);
      }
      timer = poVar1;
      plVar3 = (poVar1->_node).list.prev;
    }
    plVar3 = (info->_node).next;
    plVar2 = (info->_node).prev;
    plVar2->next = plVar3;
    plVar3->prev = plVar2;
    (info->_node).next = (list_entity *)0x0;
    (info->_node).prev = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
oonf_timer_remove(struct oonf_timer_class *info) {
  struct oonf_timer_instance *timer, *iterator;

  if (!list_is_node_added(&info->_node)) {
    /* only free node if its hooked to the timer core */
    return;
  }

  avl_for_each_element_safe(&_timer_tree, timer, _node, iterator) {
    if (timer->class == info) {
      oonf_timer_stop(timer);
    }
  }

  list_remove(&info->_node);
}